

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul-lace.c
# Opt level: O1

double maxerror(float *A,float *B,int n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
    dVar4 = 0.0;
    uVar2 = 0;
    do {
      uVar3 = 0;
      dVar5 = dVar4;
      do {
        fVar6 = (A[uVar3] - B[uVar3]) / A[uVar3];
        dVar4 = (double)fVar6;
        if (fVar6 < 0.0) {
          dVar4 = -dVar4;
        }
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
        uVar3 = uVar3 + 1;
        dVar5 = dVar4;
      } while (uVar1 != uVar3);
      uVar2 = uVar2 + 1;
      B = B + uVar1;
      A = A + uVar1;
    } while (uVar2 != uVar1);
    return dVar4;
  }
  return 0.0;
}

Assistant:

double maxerror(REAL *A, REAL *B, int n)
{
    int i, j;
    double error = 0.0;

    for (i = 0; i < n; i++) {
        for (j = 0; j < n; j++) {
            double diff = (A[i * n + j] - B[i * n + j]) / A[i * n + j];
            if (diff < 0)
                diff = -diff;
            if (diff > error)
                error = diff;
        }
    }
    return error;
}